

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O3

void __thiscall ExampleAppConsole::ExampleAppConsole(ExampleAppConsole *this)

{
  char **ppcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  
  (this->Items).Size = 0;
  (this->Items).Capacity = 0;
  (this->Items).Data = (char **)0x0;
  (this->History).Size = 0;
  (this->History).Capacity = 0;
  (this->History).Data = (char **)0x0;
  (this->Commands).Size = 0;
  (this->Commands).Capacity = 0;
  (this->Commands).Data = (char **)0x0;
  ClearLog(this);
  memset(this,0,0x100);
  this->HistoryPos = -1;
  iVar3 = (this->Commands).Size;
  if (iVar3 == (this->Commands).Capacity) {
    if (iVar3 == 0) {
      iVar2 = 8;
    }
    else {
      iVar2 = iVar3 / 2 + iVar3;
    }
    iVar4 = iVar3 + 1;
    if (iVar3 + 1 < iVar2) {
      iVar4 = iVar2;
    }
    ppcVar1 = (char **)ImGui::MemAlloc((long)iVar4 << 3);
    ppcVar5 = (this->Commands).Data;
    if (ppcVar5 == (char **)0x0) {
      ppcVar5 = (char **)0x0;
    }
    else {
      memcpy(ppcVar1,ppcVar5,(long)(this->Commands).Size << 3);
      ppcVar5 = (this->Commands).Data;
    }
    ImGui::MemFree(ppcVar5);
    (this->Commands).Data = ppcVar1;
    (this->Commands).Capacity = iVar4;
    iVar3 = (this->Commands).Size;
  }
  else {
    ppcVar1 = (this->Commands).Data;
  }
  ppcVar1[iVar3] = "HELP";
  iVar2 = (this->Commands).Size;
  iVar3 = iVar2 + 1;
  (this->Commands).Size = iVar3;
  if (iVar3 == (this->Commands).Capacity) {
    iVar2 = iVar2 + 2;
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar2 < iVar3) {
      iVar2 = iVar3;
    }
    ppcVar1 = (char **)ImGui::MemAlloc((long)iVar2 << 3);
    ppcVar5 = (this->Commands).Data;
    if (ppcVar5 == (char **)0x0) {
      ppcVar5 = (char **)0x0;
    }
    else {
      memcpy(ppcVar1,ppcVar5,(long)(this->Commands).Size << 3);
      ppcVar5 = (this->Commands).Data;
    }
    ImGui::MemFree(ppcVar5);
    (this->Commands).Data = ppcVar1;
    (this->Commands).Capacity = iVar2;
    iVar3 = (this->Commands).Size;
  }
  else {
    ppcVar1 = (this->Commands).Data;
  }
  ppcVar1[iVar3] = "HISTORY";
  iVar2 = (this->Commands).Size;
  iVar3 = iVar2 + 1;
  (this->Commands).Size = iVar3;
  if (iVar3 == (this->Commands).Capacity) {
    iVar2 = iVar2 + 2;
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar2 < iVar3) {
      iVar2 = iVar3;
    }
    ppcVar1 = (char **)ImGui::MemAlloc((long)iVar2 << 3);
    ppcVar5 = (this->Commands).Data;
    if (ppcVar5 == (char **)0x0) {
      ppcVar5 = (char **)0x0;
    }
    else {
      memcpy(ppcVar1,ppcVar5,(long)(this->Commands).Size << 3);
      ppcVar5 = (this->Commands).Data;
    }
    ImGui::MemFree(ppcVar5);
    (this->Commands).Data = ppcVar1;
    (this->Commands).Capacity = iVar2;
    iVar3 = (this->Commands).Size;
  }
  else {
    ppcVar1 = (this->Commands).Data;
  }
  ppcVar1[iVar3] = "CLEAR";
  iVar2 = (this->Commands).Size;
  iVar3 = iVar2 + 1;
  (this->Commands).Size = iVar3;
  if (iVar3 == (this->Commands).Capacity) {
    iVar2 = iVar2 + 2;
    if (iVar3 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar3 / 2 + iVar3;
    }
    if (iVar2 < iVar3) {
      iVar2 = iVar3;
    }
    ppcVar1 = (char **)ImGui::MemAlloc((long)iVar2 << 3);
    ppcVar5 = (this->Commands).Data;
    if (ppcVar5 == (char **)0x0) {
      ppcVar5 = (char **)0x0;
    }
    else {
      memcpy(ppcVar1,ppcVar5,(long)(this->Commands).Size << 3);
      ppcVar5 = (this->Commands).Data;
    }
    ImGui::MemFree(ppcVar5);
    (this->Commands).Data = ppcVar1;
    (this->Commands).Capacity = iVar2;
    iVar3 = (this->Commands).Size;
  }
  else {
    ppcVar1 = (this->Commands).Data;
  }
  ppcVar1[iVar3] = "CLASSIFY";
  (this->Commands).Size = (this->Commands).Size + 1;
  AddLog(this,"Welcome to ImGui!");
  return;
}

Assistant:

ExampleAppConsole()
    {
        ClearLog();
        memset(InputBuf, 0, sizeof(InputBuf));
        HistoryPos = -1;
        Commands.push_back("HELP");
        Commands.push_back("HISTORY");
        Commands.push_back("CLEAR");
        Commands.push_back("CLASSIFY");  // "classify" is here to provide an example of "C"+[tab] completing to "CL" and displaying matches.
        AddLog("Welcome to ImGui!");
    }